

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

string * __thiscall
gl3cts::PerVertexValidationTest::getShaderStageName_abi_cxx11_
          (string *__return_storage_ptr__,PerVertexValidationTest *this,_shader_stage shader_stage)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?!","");
  switch(shader_stage) {
  case SHADER_STAGE_FRAGMENT:
    pcVar1 = "fragment shader";
    break;
  case SHADER_STAGE_GEOMETRY:
    pcVar1 = "geometry shader";
    break;
  case SHADER_STAGE_GEOMETRY|SHADER_STAGE_FRAGMENT:
  case SHADER_STAGE_TESSELLATION_CONTROL|SHADER_STAGE_FRAGMENT:
  case SHADER_STAGE_TESSELLATION_CONTROL|SHADER_STAGE_GEOMETRY:
  case SHADER_STAGE_TESSELLATION_CONTROL|SHADER_STAGE_GEOMETRY|SHADER_STAGE_FRAGMENT:
    goto switchD_00a8d648_caseD_3;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    pcVar1 = "tessellation control shader";
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    pcVar1 = "tessellation evaluation shader";
    break;
  default:
    if (shader_stage != SHADER_STAGE_VERTEX) {
      return __return_storage_ptr__;
    }
    pcVar1 = "vertex shader";
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar1);
switchD_00a8d648_caseD_3:
  return __return_storage_ptr__;
}

Assistant:

std::string PerVertexValidationTest::getShaderStageName(_shader_stage shader_stage) const
{
	std::string result = "?!";

	switch (shader_stage)
	{
	case SHADER_STAGE_FRAGMENT:
		result = "fragment shader";
		break;
	case SHADER_STAGE_GEOMETRY:
		result = "geometry shader";
		break;
	case SHADER_STAGE_TESSELLATION_CONTROL:
		result = "tessellation control shader";
		break;
	case SHADER_STAGE_TESSELLATION_EVALUATION:
		result = "tessellation evaluation shader";
		break;
	case SHADER_STAGE_VERTEX:
		result = "vertex shader";
		break;
	}

	return result;
}